

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O3

void VP8EncDspInit(void)

{
  undefined1 auVar1 [16];
  int iVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  byte bVar16;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  undefined1 auVar17 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int iVar23;
  uint uVar24;
  uint uVar33;
  uint uVar34;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  uint uVar35;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&VP8EncDspInit::VP8EncDspInit_body_lock);
  if (iVar2 != 0) {
    return;
  }
  if (VP8EncDspInit::VP8EncDspInit_body_last_cpuinfo_used != VP8GetCPUInfo) {
    VP8DspInit();
    auVar1 = _DAT_001b6700;
    if (tables_ok == 0) {
      uVar4 = 0xffffff0d;
      uVar5 = 0xffffff0e;
      uVar6 = 0xffffff0f;
      uVar7 = 0xffffff10;
      uVar8 = 0xffffff09;
      uVar9 = 0xffffff0a;
      uVar10 = 0xffffff0b;
      uVar11 = 0xffffff0c;
      uVar12 = 0xffffff05;
      uVar13 = 0xffffff06;
      uVar14 = 0xffffff07;
      uVar15 = 0xffffff08;
      uVar36 = 0xffffff01;
      uVar37 = 0xffffff02;
      uVar38 = 0xffffff03;
      uVar39 = 0xffffff04;
      lVar3 = 0;
      do {
        auVar22._8_4_ = (int)lVar3;
        auVar22._0_8_ = lVar3;
        auVar22._12_4_ = (int)((ulong)lVar3 >> 0x20);
        auVar17 = (auVar22 | _DAT_001b6510) ^ auVar1;
        auVar40._0_4_ = -(uint)(auVar17._0_4_ < -0x7ffffd02);
        auVar40._4_4_ = -(uint)(auVar17._0_4_ < -0x7ffffd02);
        auVar40._8_4_ = -(uint)(auVar17._8_4_ < -0x7ffffd02);
        auVar40._12_4_ = -(uint)(auVar17._8_4_ < -0x7ffffd02);
        auVar25._0_4_ = -(uint)(auVar17._4_4_ == -0x80000000);
        auVar25._4_4_ = -(uint)(auVar17._4_4_ == -0x80000000);
        auVar25._8_4_ = -(uint)(auVar17._12_4_ == -0x80000000);
        auVar25._12_4_ = -(uint)(auVar17._12_4_ == -0x80000000);
        auVar25 = auVar25 & auVar40;
        auVar17 = pshuflw(auVar40,auVar25,0xe8);
        auVar17 = packssdw(auVar17,auVar17);
        uVar24 = -(uint)(0 < (int)uVar36) & uVar36;
        uVar33 = -(uint)(0 < (int)uVar37) & uVar37;
        uVar34 = -(uint)(0 < (int)uVar38) & uVar38;
        uVar35 = -(uint)(0 < (int)uVar39) & uVar39;
        bVar16 = -((int)uVar24 < 0xff);
        bVar18 = -((int)uVar33 < 0xff);
        bVar19 = -((int)uVar34 < 0xff);
        bVar20 = -((int)uVar35 < 0xff);
        if ((auVar17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          clip1[lVar3] = ~bVar16 | (byte)uVar24 & bVar16;
        }
        auVar17 = packssdw(auVar25,auVar25);
        auVar17 = packssdw(auVar17,auVar17);
        auVar17 = packsswb(auVar17,auVar17);
        if ((auVar17._0_4_ >> 8 & 1) != 0) {
          clip1[lVar3 + 1] = ~bVar18 | (byte)uVar33 & bVar18;
        }
        auVar17 = (auVar22 | _DAT_001b66f0) ^ auVar1;
        auVar41._0_4_ = -(uint)(auVar17._0_4_ < -0x7ffffd02);
        auVar41._4_4_ = -(uint)(auVar17._0_4_ < -0x7ffffd02);
        auVar41._8_4_ = -(uint)(auVar17._8_4_ < -0x7ffffd02);
        auVar41._12_4_ = -(uint)(auVar17._8_4_ < -0x7ffffd02);
        auVar26._0_4_ = -(uint)(auVar17._4_4_ == -0x80000000);
        auVar26._4_4_ = -(uint)(auVar17._4_4_ == -0x80000000);
        auVar26._8_4_ = -(uint)(auVar17._12_4_ == -0x80000000);
        auVar26._12_4_ = -(uint)(auVar17._12_4_ == -0x80000000);
        auVar17 = packssdw(auVar17,auVar26 & auVar41);
        auVar17 = packssdw(auVar17,auVar17);
        auVar17 = packsswb(auVar17,auVar17);
        if ((auVar17._0_4_ >> 0x10 & 1) != 0) {
          clip1[lVar3 + 2] = ~bVar19 | (byte)uVar34 & bVar19;
        }
        auVar17 = pshufhw(auVar17,auVar26 & auVar41,0x84);
        auVar17 = packssdw(auVar17,auVar17);
        auVar17 = packsswb(auVar17,auVar17);
        if ((auVar17._0_4_ >> 0x18 & 1) != 0) {
          clip1[lVar3 + 3] = ~bVar20 | (byte)uVar35 & bVar20;
        }
        uVar24 = -(uint)(0 < (int)uVar12) & uVar12;
        uVar33 = -(uint)(0 < (int)uVar13) & uVar13;
        uVar34 = -(uint)(0 < (int)uVar14) & uVar14;
        uVar35 = -(uint)(0 < (int)uVar15) & uVar15;
        bVar16 = -((int)uVar24 < 0xff);
        bVar18 = -((int)uVar33 < 0xff);
        bVar19 = -((int)uVar34 < 0xff);
        bVar20 = -((int)uVar35 < 0xff);
        auVar17 = (auVar22 | _DAT_001ba300) ^ auVar1;
        auVar42._0_4_ = -(uint)(auVar17._0_4_ < -0x7ffffd02);
        auVar42._4_4_ = -(uint)(auVar17._0_4_ < -0x7ffffd02);
        auVar42._8_4_ = -(uint)(auVar17._8_4_ < -0x7ffffd02);
        auVar42._12_4_ = -(uint)(auVar17._8_4_ < -0x7ffffd02);
        auVar27._0_4_ = -(uint)(auVar17._4_4_ == -0x80000000);
        auVar27._4_4_ = -(uint)(auVar17._4_4_ == -0x80000000);
        auVar27._8_4_ = -(uint)(auVar17._12_4_ == -0x80000000);
        auVar27._12_4_ = -(uint)(auVar17._12_4_ == -0x80000000);
        auVar27 = auVar27 & auVar42;
        auVar17 = pshuflw(auVar17,auVar27,0xe8);
        auVar17 = packssdw(auVar17,auVar17);
        auVar17 = packsswb(auVar17,auVar17);
        if ((auVar17 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          clip1[lVar3 + 4] = ~bVar16 | (byte)uVar24 & bVar16;
        }
        auVar25 = packssdw(auVar27,auVar27);
        auVar17 = packssdw(auVar17,auVar25);
        auVar17 = packsswb(auVar17,auVar17);
        if ((auVar17._4_2_ >> 8 & 1) != 0) {
          clip1[lVar3 + 5] = ~bVar18 | (byte)uVar33 & bVar18;
        }
        auVar17 = (auVar22 | _DAT_001ba2f0) ^ auVar1;
        auVar43._0_4_ = -(uint)(auVar17._0_4_ < -0x7ffffd02);
        auVar43._4_4_ = -(uint)(auVar17._0_4_ < -0x7ffffd02);
        auVar43._8_4_ = -(uint)(auVar17._8_4_ < -0x7ffffd02);
        auVar43._12_4_ = -(uint)(auVar17._8_4_ < -0x7ffffd02);
        auVar28._0_4_ = -(uint)(auVar17._4_4_ == -0x80000000);
        auVar28._4_4_ = -(uint)(auVar17._4_4_ == -0x80000000);
        auVar28._8_4_ = -(uint)(auVar17._12_4_ == -0x80000000);
        auVar28._12_4_ = -(uint)(auVar17._12_4_ == -0x80000000);
        auVar17 = packssdw(auVar17,auVar28 & auVar43);
        auVar17 = packssdw(auVar17,auVar17);
        auVar17 = packsswb(auVar17,auVar17);
        if ((auVar17 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          clip1[lVar3 + 6] = ~bVar19 | (byte)uVar34 & bVar19;
        }
        auVar17 = pshufhw(auVar17,auVar28 & auVar43,0x84);
        auVar17 = packssdw(auVar17,auVar17);
        auVar17 = packsswb(auVar17,auVar17);
        if ((auVar17._6_2_ >> 8 & 1) != 0) {
          clip1[lVar3 + 7] = ~bVar20 | (byte)uVar35 & bVar20;
        }
        uVar24 = -(uint)(0 < (int)uVar8) & uVar8;
        uVar33 = -(uint)(0 < (int)uVar9) & uVar9;
        uVar34 = -(uint)(0 < (int)uVar10) & uVar10;
        uVar35 = -(uint)(0 < (int)uVar11) & uVar11;
        bVar16 = -((int)uVar24 < 0xff);
        bVar18 = -((int)uVar33 < 0xff);
        bVar19 = -((int)uVar34 < 0xff);
        bVar20 = -((int)uVar35 < 0xff);
        auVar17 = (auVar22 | _DAT_001ba2e0) ^ auVar1;
        auVar44._0_4_ = -(uint)(auVar17._0_4_ < -0x7ffffd02);
        auVar44._4_4_ = -(uint)(auVar17._0_4_ < -0x7ffffd02);
        auVar44._8_4_ = -(uint)(auVar17._8_4_ < -0x7ffffd02);
        auVar44._12_4_ = -(uint)(auVar17._8_4_ < -0x7ffffd02);
        auVar29._0_4_ = -(uint)(auVar17._4_4_ == -0x80000000);
        auVar29._4_4_ = -(uint)(auVar17._4_4_ == -0x80000000);
        auVar29._8_4_ = -(uint)(auVar17._12_4_ == -0x80000000);
        auVar29._12_4_ = -(uint)(auVar17._12_4_ == -0x80000000);
        auVar29 = auVar29 & auVar44;
        auVar17 = pshuflw(auVar17,auVar29,0xe8);
        auVar17 = packssdw(auVar17,auVar17);
        auVar17 = packsswb(auVar17,auVar17);
        if ((auVar17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          clip1[lVar3 + 8] = ~bVar16 | (byte)uVar24 & bVar16;
        }
        auVar25 = packssdw(auVar29,auVar29);
        auVar25 = packssdw(auVar25,auVar25);
        auVar17 = packsswb(auVar17,auVar25);
        if ((auVar17._8_2_ >> 8 & 1) != 0) {
          clip1[lVar3 + 9] = ~bVar18 | (byte)uVar33 & bVar18;
        }
        auVar17 = (auVar22 | _DAT_001ba2d0) ^ auVar1;
        auVar45._0_4_ = -(uint)(auVar17._0_4_ < -0x7ffffd02);
        auVar45._4_4_ = -(uint)(auVar17._0_4_ < -0x7ffffd02);
        auVar45._8_4_ = -(uint)(auVar17._8_4_ < -0x7ffffd02);
        auVar45._12_4_ = -(uint)(auVar17._8_4_ < -0x7ffffd02);
        auVar30._0_4_ = -(uint)(auVar17._4_4_ == -0x80000000);
        auVar30._4_4_ = -(uint)(auVar17._4_4_ == -0x80000000);
        auVar30._8_4_ = -(uint)(auVar17._12_4_ == -0x80000000);
        auVar30._12_4_ = -(uint)(auVar17._12_4_ == -0x80000000);
        auVar17 = packssdw(auVar17,auVar30 & auVar45);
        auVar17 = packssdw(auVar17,auVar17);
        auVar17 = packsswb(auVar17,auVar17);
        if ((auVar17 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          clip1[lVar3 + 10] = ~bVar19 | (byte)uVar34 & bVar19;
        }
        auVar17 = pshufhw(auVar17,auVar30 & auVar45,0x84);
        auVar17 = packssdw(auVar17,auVar17);
        auVar17 = packsswb(auVar17,auVar17);
        if ((auVar17._10_2_ >> 8 & 1) != 0) {
          clip1[lVar3 + 0xb] = ~bVar20 | (byte)uVar35 & bVar20;
        }
        uVar24 = -(uint)(0 < (int)uVar4) & uVar4;
        uVar33 = -(uint)(0 < (int)uVar5) & uVar5;
        uVar34 = -(uint)(0 < (int)uVar6) & uVar6;
        uVar35 = -(uint)(0 < (int)uVar7) & uVar7;
        bVar16 = -((int)uVar24 < 0xff);
        bVar18 = -((int)uVar33 < 0xff);
        bVar19 = -((int)uVar34 < 0xff);
        bVar20 = -((int)uVar35 < 0xff);
        auVar17 = (auVar22 | _DAT_001ba2c0) ^ auVar1;
        auVar46._0_4_ = -(uint)(auVar17._0_4_ < -0x7ffffd02);
        auVar46._4_4_ = -(uint)(auVar17._0_4_ < -0x7ffffd02);
        auVar46._8_4_ = -(uint)(auVar17._8_4_ < -0x7ffffd02);
        auVar46._12_4_ = -(uint)(auVar17._8_4_ < -0x7ffffd02);
        auVar31._0_4_ = -(uint)(auVar17._4_4_ == -0x80000000);
        auVar31._4_4_ = -(uint)(auVar17._4_4_ == -0x80000000);
        auVar31._8_4_ = -(uint)(auVar17._12_4_ == -0x80000000);
        auVar31._12_4_ = -(uint)(auVar17._12_4_ == -0x80000000);
        auVar31 = auVar31 & auVar46;
        auVar17 = pshuflw(auVar17,auVar31,0xe8);
        auVar17 = packssdw(auVar17,auVar17);
        auVar17 = packsswb(auVar17,auVar17);
        if ((auVar17 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          clip1[lVar3 + 0xc] = ~bVar16 | (byte)uVar24 & bVar16;
        }
        auVar25 = packssdw(auVar31,auVar31);
        auVar17 = packssdw(auVar17,auVar25);
        auVar17 = packsswb(auVar17,auVar17);
        if ((auVar17._12_2_ >> 8 & 1) != 0) {
          clip1[lVar3 + 0xd] = ~bVar18 | (byte)uVar33 & bVar18;
        }
        auVar17 = (auVar22 | _DAT_001ba2b0) ^ auVar1;
        iVar2 = auVar17._4_4_;
        iVar23 = auVar17._12_4_;
        auVar32._0_4_ = -(uint)(auVar17._0_4_ < -0x7ffffd02);
        auVar32._4_4_ = -(uint)(auVar17._0_4_ < -0x7ffffd02);
        auVar32._8_4_ = -(uint)(auVar17._8_4_ < -0x7ffffd02);
        auVar32._12_4_ = -(uint)(auVar17._8_4_ < -0x7ffffd02);
        auVar17._4_4_ = iVar2;
        auVar17._0_4_ = iVar2;
        auVar17._8_4_ = iVar23;
        auVar17._12_4_ = iVar23;
        auVar21._0_4_ = -(uint)(iVar2 == -0x80000000);
        auVar21._4_4_ = -(uint)(iVar2 == -0x80000000);
        auVar21._8_4_ = -(uint)(iVar23 == -0x80000000);
        auVar21._12_4_ = -(uint)(iVar23 == -0x80000000);
        auVar17 = packssdw(auVar17,auVar21 & auVar32);
        auVar17 = packssdw(auVar17,auVar17);
        auVar17 = packsswb(auVar17,auVar17);
        if ((auVar17 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          clip1[lVar3 + 0xe] = ~bVar19 | (byte)uVar34 & bVar19;
        }
        auVar17 = pshufhw(auVar17,auVar21 & auVar32,0x84);
        auVar17 = packssdw(auVar17,auVar17);
        auVar17 = packsswb(auVar17,auVar17);
        if ((auVar17._14_2_ >> 8 & 1) != 0) {
          clip1[lVar3 + 0xf] = ~bVar20 | (byte)uVar35 & bVar20;
        }
        lVar3 = lVar3 + 0x10;
        uVar36 = uVar36 + 0x10;
        uVar37 = uVar37 + 0x10;
        uVar38 = uVar38 + 0x10;
        uVar39 = uVar39 + 0x10;
        uVar12 = uVar12 + 0x10;
        uVar13 = uVar13 + 0x10;
        uVar14 = uVar14 + 0x10;
        uVar15 = uVar15 + 0x10;
        uVar8 = uVar8 + 0x10;
        uVar9 = uVar9 + 0x10;
        uVar10 = uVar10 + 0x10;
        uVar11 = uVar11 + 0x10;
        uVar4 = uVar4 + 0x10;
        uVar5 = uVar5 + 0x10;
        uVar6 = uVar6 + 0x10;
        uVar7 = uVar7 + 0x10;
      } while (lVar3 != 0x300);
      tables_ok = 1;
    }
    VP8ITransform = ITransform_C;
    VP8FTransform = FTransform_C;
    VP8FTransformWHT = FTransformWHT_C;
    VP8TDisto4x4 = Disto4x4_C;
    VP8TDisto16x16 = Disto16x16_C;
    VP8CollectHistogram = CollectHistogram_C;
    VP8SSE16x16 = SSE16x16_C;
    VP8SSE16x8 = SSE16x8_C;
    VP8SSE8x8 = SSE8x8_C;
    VP8SSE4x4 = SSE4x4_C;
    VP8EncQuantizeBlock = QuantizeBlock_C;
    VP8EncQuantize2Blocks = Quantize2Blocks_C;
    VP8EncQuantizeBlockWHT = QuantizeBlock_C;
    VP8EncPredLuma4 = Intra4Preds_C;
    VP8EncPredLuma16 = Intra16Preds_C;
    VP8FTransform2 = FTransform2_C;
    VP8EncPredChroma8 = IntraChromaPreds_C;
    VP8Mean16x4 = Mean16x4_C;
    VP8Copy4x4 = Copy4x4_C;
    VP8Copy16x8 = Copy16x8_C;
    if (VP8GetCPUInfo != (VP8CPUInfo)0x0) {
      iVar2 = (*VP8GetCPUInfo)(kSSE2);
      if (iVar2 != 0) {
        VP8EncDspInitSSE2();
        iVar2 = (*VP8GetCPUInfo)(kSSE4_1);
        if (iVar2 != 0) {
          VP8EncDspInitSSE41();
        }
      }
    }
  }
  VP8EncDspInit::VP8EncDspInit_body_last_cpuinfo_used = VP8GetCPUInfo;
  pthread_mutex_unlock((pthread_mutex_t *)&VP8EncDspInit::VP8EncDspInit_body_lock);
  return;
}

Assistant:

WEBP_DSP_INIT_FUNC(VP8EncDspInit) {
  VP8DspInit();  // common inverse transforms
  InitTables();

  // default C implementations
#if !WEBP_NEON_OMIT_C_CODE
  VP8ITransform = ITransform_C;
  VP8FTransform = FTransform_C;
  VP8FTransformWHT = FTransformWHT_C;
  VP8TDisto4x4 = Disto4x4_C;
  VP8TDisto16x16 = Disto16x16_C;
  VP8CollectHistogram = CollectHistogram_C;
  VP8SSE16x16 = SSE16x16_C;
  VP8SSE16x8 = SSE16x8_C;
  VP8SSE8x8 = SSE8x8_C;
  VP8SSE4x4 = SSE4x4_C;
#endif

#if !WEBP_NEON_OMIT_C_CODE || WEBP_NEON_WORK_AROUND_GCC
  VP8EncQuantizeBlock = QuantizeBlock_C;
  VP8EncQuantize2Blocks = Quantize2Blocks_C;
  VP8EncQuantizeBlockWHT = QuantizeBlock_C;
#endif

#if !WEBP_NEON_OMIT_C_CODE || !WEBP_AARCH64 || BPS != 32
  VP8EncPredLuma4 = Intra4Preds_C;
#endif
#if !WEBP_NEON_OMIT_C_CODE || !WEBP_AARCH64
  VP8EncPredLuma16 = Intra16Preds_C;
#endif

  VP8FTransform2 = FTransform2_C;
  VP8EncPredChroma8 = IntraChromaPreds_C;
  VP8Mean16x4 = Mean16x4_C;
  VP8Copy4x4 = Copy4x4_C;
  VP8Copy16x8 = Copy16x8_C;

  // If defined, use CPUInfo() to overwrite some pointers with faster versions.
  if (VP8GetCPUInfo != NULL) {
#if defined(WEBP_HAVE_SSE2)
    if (VP8GetCPUInfo(kSSE2)) {
      VP8EncDspInitSSE2();
#if defined(WEBP_HAVE_SSE41)
      if (VP8GetCPUInfo(kSSE4_1)) {
        VP8EncDspInitSSE41();
      }
#endif
    }
#endif
#if defined(WEBP_USE_MIPS32)
    if (VP8GetCPUInfo(kMIPS32)) {
      VP8EncDspInitMIPS32();
    }
#endif
#if defined(WEBP_USE_MIPS_DSP_R2)
    if (VP8GetCPUInfo(kMIPSdspR2)) {
      VP8EncDspInitMIPSdspR2();
    }
#endif
#if defined(WEBP_USE_MSA)
    if (VP8GetCPUInfo(kMSA)) {
      VP8EncDspInitMSA();
    }
#endif
  }

#if defined(WEBP_HAVE_NEON)
  if (WEBP_NEON_OMIT_C_CODE ||
      (VP8GetCPUInfo != NULL && VP8GetCPUInfo(kNEON))) {
    VP8EncDspInitNEON();
  }
#endif

  assert(VP8ITransform != NULL);
  assert(VP8FTransform != NULL);
  assert(VP8FTransformWHT != NULL);
  assert(VP8TDisto4x4 != NULL);
  assert(VP8TDisto16x16 != NULL);
  assert(VP8CollectHistogram != NULL);
  assert(VP8SSE16x16 != NULL);
  assert(VP8SSE16x8 != NULL);
  assert(VP8SSE8x8 != NULL);
  assert(VP8SSE4x4 != NULL);
  assert(VP8EncQuantizeBlock != NULL);
  assert(VP8EncQuantize2Blocks != NULL);
  assert(VP8FTransform2 != NULL);
  assert(VP8EncPredLuma4 != NULL);
  assert(VP8EncPredLuma16 != NULL);
  assert(VP8EncPredChroma8 != NULL);
  assert(VP8Mean16x4 != NULL);
  assert(VP8EncQuantizeBlockWHT != NULL);
  assert(VP8Copy4x4 != NULL);
  assert(VP8Copy16x8 != NULL);
}